

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O3

void __thiscall chrono::viper::Viper::Create(Viper *this,ViperWheelType wheel_type)

{
  shared_ptr<chrono::ChMaterialSurface> *__args_2;
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  Viper *pVVar5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined1 auVar8 [8];
  double dVar9;
  double dVar10;
  ViperLowerArm *pVVar11;
  long lVar12;
  undefined8 *puVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  uint local_218;
  undefined1 local_211;
  Viper *local_210;
  undefined8 local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  shared_ptr<chrono::ChMaterialSurface> *local_1f8;
  ViperWheelType local_1ec;
  undefined1 local_1e8 [8];
  undefined1 auStack_1e0 [24];
  undefined8 uStack_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1c0;
  double dStack_1b8;
  double dStack_1b0;
  ChMatrix33<double> local_1a8;
  ChQuaternion<double> local_158;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  ViperLowerArm *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 local_98 [13];
  
  local_1f8 = &this->m_default_material;
  local_1e8 = (undefined1  [8])0x0;
  local_1ec = wheel_type;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::viper::ViperChassis,std::allocator<chrono::viper::ViperChassis>,char_const(&)[8],std::shared_ptr<chrono::ChMaterialSurface>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_1e0,(ViperChassis **)local_1e8,
             (allocator<chrono::viper::ViperChassis> *)&local_158,(char (*) [8])0x1697e4,local_1f8);
  auVar8 = local_1e8;
  uVar1 = auStack_1e0._0_8_;
  local_1e8 = (undefined1  [8])0x0;
  auVar3._24_8_ = 0;
  auVar3._0_24_ = stack0xfffffffffffffe28;
  _auStack_1e0 = auVar3 << 0x40;
  p_Var2 = (this->m_chassis).
           super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_chassis).super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)auVar8;
  (this->m_chassis).super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e0._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e0._0_8_);
    }
  }
  local_1e8 = (undefined1  [8])&PTR__ChFrame_0017db90;
  auStack_1e0._8_8_ = 0x3fe3837b4a2339c0;
  auStack_1e0._0_8_ = 0x3fe489a027525460;
  auStack_1e0._16_8_ = 0;
  uStack_1c8 = QUNIT;
  p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_1b8 = _ChBody;
  dStack_1b0 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_1a8,(ChQuaternion<double> *)&QUNIT);
  __args_2 = &this->m_wheel_material;
  local_158.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::viper::ViperWheel,std::allocator<chrono::viper::ViperWheel>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158.m_data + 1),
             (ViperWheel **)&local_158,(allocator<chrono::viper::ViperWheel> *)local_98,
             (char (*) [9])"wheel_LF",(ChFrame<double> *)local_1e8,__args_2,&local_1ec);
  dVar10 = local_158.m_data[1];
  dVar9 = local_158.m_data[0];
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  p_Var2 = (this->m_wheels)._M_elems[0].
           super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_wheels)._M_elems[0].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar9;
  (this->m_wheels)._M_elems[0].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar10;
  local_210 = this;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1]);
    }
  }
  local_1e8 = (undefined1  [8])&PTR__ChFrame_0017db90;
  auStack_1e0._8_8_ = 0xbfe3837b4a2339c0;
  auStack_1e0._0_8_ = 0x3fe489a027525460;
  auStack_1e0._16_8_ = 0;
  uStack_1c8 = QUNIT;
  p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_1b8 = _ChBody;
  dStack_1b0 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_1a8,(ChQuaternion<double> *)&QUNIT);
  local_158.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::viper::ViperWheel,std::allocator<chrono::viper::ViperWheel>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158.m_data + 1),
             (ViperWheel **)&local_158,(allocator<chrono::viper::ViperWheel> *)local_98,
             (char (*) [9])"wheel_RF",(ChFrame<double> *)local_1e8,__args_2,&local_1ec);
  dVar10 = local_158.m_data[1];
  dVar9 = local_158.m_data[0];
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  p_Var2 = (local_210->m_wheels)._M_elems[1].
           super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (local_210->m_wheels)._M_elems[1].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar9;
  (local_210->m_wheels)._M_elems[1].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar10;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1]);
    }
  }
  local_1e8 = (undefined1  [8])&PTR__ChFrame_0017db90;
  auStack_1e0._8_8_ = 0x3fe3837b4a2339c0;
  auStack_1e0._0_8_ = 0xbfe489a027525460;
  auStack_1e0._16_8_ = 0;
  uStack_1c8 = QUNIT;
  p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_1b8 = _ChBody;
  dStack_1b0 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_1a8,(ChQuaternion<double> *)&QUNIT);
  local_158.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::viper::ViperWheel,std::allocator<chrono::viper::ViperWheel>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158.m_data + 1),
             (ViperWheel **)&local_158,(allocator<chrono::viper::ViperWheel> *)local_98,
             (char (*) [9])"wheel_LB",(ChFrame<double> *)local_1e8,__args_2,&local_1ec);
  dVar10 = local_158.m_data[1];
  dVar9 = local_158.m_data[0];
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  p_Var2 = (local_210->m_wheels)._M_elems[2].
           super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (local_210->m_wheels)._M_elems[2].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar9;
  (local_210->m_wheels)._M_elems[2].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar10;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1]);
    }
  }
  local_1e8 = (undefined1  [8])&PTR__ChFrame_0017db90;
  auStack_1e0._8_8_ = 0xbfe3837b4a2339c0;
  auStack_1e0._0_8_ = 0xbfe489a027525460;
  auStack_1e0._16_8_ = 0;
  uStack_1c8 = QUNIT;
  p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_1b8 = _ChBody;
  dStack_1b0 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_1a8,(ChQuaternion<double> *)&QUNIT);
  local_158.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::viper::ViperWheel,std::allocator<chrono::viper::ViperWheel>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158.m_data + 1),
             (ViperWheel **)&local_158,(allocator<chrono::viper::ViperWheel> *)local_98,
             (char (*) [9])"wheel_RB",(ChFrame<double> *)local_1e8,__args_2,&local_1ec);
  dVar10 = local_158.m_data[1];
  dVar9 = local_158.m_data[0];
  pVVar5 = local_210;
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  p_Var2 = (local_210->m_wheels)._M_elems[3].
           super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (local_210->m_wheels)._M_elems[3].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar9;
  (local_210->m_wheels)._M_elems[3].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar10;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1]);
    }
  }
  chrono::Q_from_AngZ(3.141592653589793);
  auVar16._8_8_ = _UpdateForces;
  auVar16._0_8_ = _UpdateForces;
  auVar16._16_8_ = _UpdateForces;
  auVar16._24_8_ = _UpdateForces;
  local_1e8 = (undefined1  [8])&PTR__ChFrame_0017db90;
  auVar3 = vblendps_avx(ZEXT1632(_VNULL),auVar16,0x30);
  auVar21._8_8_ = local_158.m_data[0];
  auVar21._0_8_ = local_158.m_data[0];
  auVar21._16_8_ = local_158.m_data[0];
  auVar21._24_8_ = local_158.m_data[0];
  _auStack_1e0 = vblendps_avx(auVar3,auVar21,0xc0);
  p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1];
  dStack_1b8 = local_158.m_data[2];
  dStack_1b0 = local_158.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_1a8,&local_158);
  ChFrame<double>::operator=
            (&(((pVVar5->m_wheels)._M_elems[0].
                super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ViperPart).m_mesh_xform,(ChFrame<double> *)local_1e8);
  chrono::Q_from_AngZ(3.141592653589793);
  auVar17._8_8_ = _UpdateForces;
  auVar17._0_8_ = _UpdateForces;
  auVar17._16_8_ = _UpdateForces;
  auVar17._24_8_ = _UpdateForces;
  local_1e8 = (undefined1  [8])&PTR__ChFrame_0017db90;
  auVar3 = vblendps_avx(ZEXT1632(_VNULL),auVar17,0x30);
  auVar22._8_8_ = local_158.m_data[0];
  auVar22._0_8_ = local_158.m_data[0];
  auVar22._16_8_ = local_158.m_data[0];
  auVar22._24_8_ = local_158.m_data[0];
  _auStack_1e0 = vblendps_avx(auVar3,auVar22,0xc0);
  p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1];
  dStack_1b8 = local_158.m_data[2];
  dStack_1b0 = local_158.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_1a8,&local_158);
  ChFrame<double>::operator=
            (&(((pVVar5->m_wheels)._M_elems[2].
                super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ViperPart).m_mesh_xform,(ChFrame<double> *)local_1e8);
  p_Var14 = &(pVVar5->m_lower_arms)._M_elems[0].
             super___shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  lVar15 = 0x10;
  lVar12 = 0;
  local_158.m_data[0] = 0.6417999999999999;
  local_158.m_data[1] = 0.2067;
  local_158.m_data[2] = -0.0525;
  local_158.m_data[3] = 0.6417999999999999;
  uStack_138 = 0xbfca7525460aa64c;
  uStack_130 = 0xbfaae147ae147ae1;
  uStack_128 = 0xbfe489a027525460;
  uStack_120 = 0x3fca7525460aa64c;
  local_98[0] = 0x3fe489a027525460;
  local_98[1] = 0x3fca7525460aa64c;
  local_98[2] = 0x3faae147ae147ae1;
  local_98[3] = 0x3fe489a027525460;
  local_98[4] = 0xbfca7525460aa64c;
  local_98[5] = 0x3faae147ae147ae1;
  local_98[6] = 0xbfe489a027525460;
  local_98[7] = 0x3fca7525460aa64c;
  local_118 = 0xbfaae147ae147ae1;
  uStack_110 = 0xbfe489a027525460;
  uStack_108 = 0xbfca7525460aa64c;
  uStack_100 = 0xbfaae147ae147ae1;
  local_98[8] = 0x3faae147ae147ae1;
  local_98[9] = 0xbfe489a027525460;
  local_98[10] = 0xbfca7525460aa64c;
  local_98[0xb] = 0x3faae147ae147ae1;
  do {
    uVar1 = *(undefined8 *)((long)local_158.m_data + lVar15);
    auVar18._8_8_ = uVar1;
    auVar18._0_8_ = uVar1;
    auVar18._16_8_ = uVar1;
    auVar18._24_8_ = uVar1;
    local_1e8 = (undefined1  [8])&PTR__ChFrame_0017db90;
    auVar3 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])
                                    ((long)local_1a8.super_Matrix<double,_3,_3,_1,_3,_3>.
                                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                           .m_storage.m_data.array + lVar15 + 0x40)),auVar18,0x30);
    auVar23._8_8_ = QUNIT;
    auVar23._0_8_ = QUNIT;
    auVar23._16_8_ = QUNIT;
    auVar23._24_8_ = QUNIT;
    _auStack_1e0 = vblendps_avx(auVar3,auVar23,0xc0);
    p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
    dStack_1b8 = _ChBody;
    dStack_1b0 = _ComputeMassProperties;
    ChMatrix33<double>::ChMatrix33(&local_1a8,(ChQuaternion<double> *)&QUNIT);
    local_f8 = (element_type *)0x0;
    local_208 = (ViperUpright *)(CONCAT44(local_208._4_4_,(int)lVar12) & 0xffffffff00000001);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::viper::ViperLowerArm,std::allocator<chrono::viper::ViperLowerArm>,char_const(&)[10],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
              (&_Stack_f0,&local_f8,(allocator<chrono::viper::ViperLowerArm> *)&local_218,
               (char (*) [10])"lower_arm",(ChFrame<double> *)local_1e8,local_1f8,(int *)&local_208);
    _Var7._M_pi = _Stack_f0._M_pi;
    pVVar11 = local_f8;
    local_f8 = (ViperLowerArm *)0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = p_Var14->_M_pi;
    ((__shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2> *)(p_Var14 + -1))->
    _M_ptr = pVVar11;
    p_Var14->_M_pi = _Var7._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      if (_Stack_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
      }
    }
    uVar1 = *(undefined8 *)((long)local_98 + lVar15);
    auVar19._8_8_ = uVar1;
    auVar19._0_8_ = uVar1;
    auVar19._16_8_ = uVar1;
    auVar19._24_8_ = uVar1;
    local_1e8 = (undefined1  [8])&PTR__ChFrame_0017db90;
    auVar3 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])((long)&uStack_a8 + lVar15)),auVar19,0x30);
    auVar24._8_8_ = QUNIT;
    auVar24._0_8_ = QUNIT;
    auVar24._16_8_ = QUNIT;
    auVar24._24_8_ = QUNIT;
    _auStack_1e0 = vblendps_avx(auVar3,auVar24,0xc0);
    p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
    dStack_1b8 = _ChBody;
    dStack_1b0 = _ComputeMassProperties;
    ChMatrix33<double>::ChMatrix33(&local_1a8,(ChQuaternion<double> *)&QUNIT);
    local_208 = (ViperUpright *)(CONCAT44(local_208._4_4_,(int)lVar12) & 0xffffffff00000001);
    local_f8 = (ViperLowerArm *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::viper::ViperUpperArm,std::allocator<chrono::viper::ViperUpperArm>,char_const(&)[10],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
              (&_Stack_f0,(ViperUpperArm **)&local_f8,
               (allocator<chrono::viper::ViperUpperArm> *)&local_218,(char (*) [10])"upper_arm",
               (ChFrame<double> *)local_1e8,local_1f8,(int *)&local_208);
    _Var7._M_pi = _Stack_f0._M_pi;
    pVVar11 = local_f8;
    local_f8 = (ViperLowerArm *)0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = p_Var14[-8]._M_pi;
    p_Var14[-9] = (__shared_count<(__gnu_cxx::_Lock_policy)2>)pVVar11;
    p_Var14[-8] = (__shared_count<(__gnu_cxx::_Lock_policy)2>)_Var7._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      if (_Stack_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
      }
    }
    lVar12 = lVar12 + 1;
    lVar15 = lVar15 + 0x18;
    p_Var14 = p_Var14 + 2;
  } while (lVar12 != 4);
  puVar13 = &uStack_e8;
  lVar12 = 0;
  p_Var14 = &(local_210->m_uprights)._M_elems[0].
             super___shared_ptr<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  local_f8 = (ViperLowerArm *)0x3fe489a027525460;
  _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fe3837b4a2339c0;
  uStack_e8 = 0x8000000000000000;
  uStack_e0 = 0x3fe489a027525460;
  uStack_d8 = 0xbfe3837b4a2339c0;
  uStack_d0 = 0x8000000000000000;
  uStack_c8 = 0xbfe489a027525460;
  uStack_c0 = 0x3fe3837b4a2339c0;
  local_b8 = 0x8000000000000000;
  uStack_b0 = 0xbfe489a027525460;
  uStack_a8 = 0xbfe3837b4a2339c0;
  uStack_a0 = 0x8000000000000000;
  do {
    uVar1 = *puVar13;
    auVar20._8_8_ = uVar1;
    auVar20._0_8_ = uVar1;
    auVar20._16_8_ = uVar1;
    auVar20._24_8_ = uVar1;
    local_1e8 = (undefined1  [8])&PTR__ChFrame_0017db90;
    auVar3 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])(puVar13 + -2)),auVar20,0x30);
    auVar25._8_8_ = QUNIT;
    auVar25._0_8_ = QUNIT;
    auVar25._16_8_ = QUNIT;
    auVar25._24_8_ = QUNIT;
    _auStack_1e0 = vblendps_avx(auVar3,auVar25,0xc0);
    p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
    dStack_1b8 = _ChBody;
    dStack_1b0 = _ComputeMassProperties;
    ChMatrix33<double>::ChMatrix33(&local_1a8,(ChQuaternion<double> *)&QUNIT);
    local_218 = (uint)lVar12 & 1;
    local_208 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::viper::ViperUpright,std::allocator<chrono::viper::ViperUpright>,char_const(&)[8],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
              (&_Stack_200,(ViperUpright **)&local_208,
               (allocator<chrono::viper::ViperUpright> *)&local_211,(char (*) [8])"upright",
               (ChFrame<double> *)local_1e8,local_1f8,(int *)&local_218);
    _Var7._M_pi = _Stack_200._M_pi;
    peVar6 = local_208;
    local_208 = (ViperUpright *)0x0;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = p_Var14->_M_pi;
    ((__shared_ptr<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2> *)(p_Var14 + -1))->
    _M_ptr = peVar6;
    p_Var14->_M_pi = _Var7._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
      }
    }
    pVVar5 = local_210;
    lVar12 = lVar12 + 1;
    puVar13 = puVar13 + 3;
    p_Var14 = p_Var14 + 2;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    local_1e8 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_1e0,(ChShaft **)local_1e8,
               (allocator<chrono::ChShaft> *)&local_208);
    auVar8 = local_1e8;
    uVar1 = auStack_1e0._0_8_;
    local_1e8 = (undefined1  [8])0x0;
    auVar4._24_8_ = 0;
    auVar4._0_24_ = stack0xfffffffffffffe28;
    _auStack_1e0 = auVar4 << 0x40;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(pVVar5->m_drive_shafts)._M_elems[0].
                      super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi + lVar12);
    puVar13 = (undefined8 *)
              ((long)&(pVVar5->m_drive_shafts)._M_elems[0].
                      super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              lVar12);
    *puVar13 = auVar8;
    puVar13[1] = uVar1;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e0._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e0._0_8_);
      }
    }
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x40);
  return;
}

Assistant:

void Viper::Create(ViperWheelType wheel_type) {
    // create rover chassis
    m_chassis = chrono_types::make_shared<ViperChassis>("chassis", m_default_material);

    // initilize rover wheels
    double wx = 0.5618 + 0.08;
    double wy = 0.2067 + 0.32 + 0.0831;
    double wz = 0.0;

    m_wheels[V_LF] = chrono_types::make_shared<ViperWheel>("wheel_LF", ChFrame<>(ChVector<>(+wx, +wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_RF] = chrono_types::make_shared<ViperWheel>("wheel_RF", ChFrame<>(ChVector<>(+wx, -wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_LB] = chrono_types::make_shared<ViperWheel>("wheel_LB", ChFrame<>(ChVector<>(-wx, +wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_RB] = chrono_types::make_shared<ViperWheel>("wheel_RB", ChFrame<>(ChVector<>(-wx, -wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);

    m_wheels[V_LF]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[V_LB]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));

    // create rover upper and lower suspension arms
    double cr_lx = 0.5618 + 0.08;
    double cr_ly = 0.2067;  // + 0.32/2;
    double cr_lz = 0.0525;

    ChVector<> cr_rel_pos_lower[] = {
        ChVector<>(+cr_lx, +cr_ly, -cr_lz),  // LF
        ChVector<>(+cr_lx, -cr_ly, -cr_lz),  // RF
        ChVector<>(-cr_lx, +cr_ly, -cr_lz),  // LB
        ChVector<>(-cr_lx, -cr_ly, -cr_lz)   // RB
    };

    ChVector<> cr_rel_pos_upper[] = {
        ChVector<>(+cr_lx, +cr_ly, cr_lz),  // LF
        ChVector<>(+cr_lx, -cr_ly, cr_lz),  // RF
        ChVector<>(-cr_lx, +cr_ly, cr_lz),  // LB
        ChVector<>(-cr_lx, -cr_ly, cr_lz)   // RB
    };

    for (int i = 0; i < 4; i++) {
        m_lower_arms[i] = chrono_types::make_shared<ViperLowerArm>("lower_arm", ChFrame<>(cr_rel_pos_lower[i], QUNIT),
                                                                   m_default_material, i % 2);
        m_upper_arms[i] = chrono_types::make_shared<ViperUpperArm>("upper_arm", ChFrame<>(cr_rel_pos_upper[i], QUNIT),
                                                                   m_default_material, i % 2);
    }

    // create uprights
    double sr_lx = 0.5618 + 0.08;
    double sr_ly = 0.2067 + 0.32 + 0.0831;
    double sr_lz = 0.0;
    ChVector<> sr_rel_pos[] = {
        ChVector<>(+sr_lx, +sr_ly, -sr_lz),  // LF
        ChVector<>(+sr_lx, -sr_ly, -sr_lz),  // RF
        ChVector<>(-sr_lx, +sr_ly, -sr_lz),  // LB
        ChVector<>(-sr_lx, -sr_ly, -sr_lz)   // RB
    };

    for (int i = 0; i < 4; i++) {
        m_uprights[i] = chrono_types::make_shared<ViperUpright>("upright", ChFrame<>(sr_rel_pos[i], QUNIT),
                                                                m_default_material, i % 2);
    }

    // create drive shafts
    for (int i = 0; i < 4; i++) {
        m_drive_shafts[i] = chrono_types::make_shared<ChShaft>();
    }
}